

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::RegexReplaceBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  RegexpReplaceBindData *this_00;
  reference pvVar2;
  type pEVar3;
  pointer pRVar4;
  pointer pRVar5;
  _Head_base<0UL,_duckdb::RegexpReplaceBindData_*,_false> local_30;
  
  this_00 = (RegexpReplaceBindData *)operator_new(0x48);
  RegexpReplaceBindData::RegexpReplaceBindData(this_00);
  local_30._M_head_impl = this_00;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar2);
  pRVar4 = unique_ptr<duckdb::RegexpReplaceBindData,_std::default_delete<duckdb::RegexpReplaceBindData>,_true>
           ::operator->((unique_ptr<duckdb::RegexpReplaceBindData,_std::default_delete<duckdb::RegexpReplaceBindData>,_true>
                         *)&local_30);
  bVar1 = regexp_util::TryParseConstantPattern
                    (context,pEVar3,&(pRVar4->super_RegexpBaseBindData).constant_string);
  pRVar4 = unique_ptr<duckdb::RegexpReplaceBindData,_std::default_delete<duckdb::RegexpReplaceBindData>,_true>
           ::operator->((unique_ptr<duckdb::RegexpReplaceBindData,_std::default_delete<duckdb::RegexpReplaceBindData>,_true>
                         *)&local_30);
  (pRVar4->super_RegexpBaseBindData).constant_pattern = bVar1;
  if ((long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,3);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar2);
    pRVar4 = unique_ptr<duckdb::RegexpReplaceBindData,_std::default_delete<duckdb::RegexpReplaceBindData>,_true>
             ::operator->((unique_ptr<duckdb::RegexpReplaceBindData,_std::default_delete<duckdb::RegexpReplaceBindData>,_true>
                           *)&local_30);
    pRVar5 = unique_ptr<duckdb::RegexpReplaceBindData,_std::default_delete<duckdb::RegexpReplaceBindData>,_true>
             ::operator->((unique_ptr<duckdb::RegexpReplaceBindData,_std::default_delete<duckdb::RegexpReplaceBindData>,_true>
                           *)&local_30);
    regexp_util::ParseRegexOptions
              (context,pEVar3,&(pRVar4->super_RegexpBaseBindData).options,
               (bool *)&(pRVar5->super_RegexpBaseBindData).field_0x41);
  }
  pRVar4 = unique_ptr<duckdb::RegexpReplaceBindData,_std::default_delete<duckdb::RegexpReplaceBindData>,_true>
           ::operator->((unique_ptr<duckdb::RegexpReplaceBindData,_std::default_delete<duckdb::RegexpReplaceBindData>,_true>
                         *)&local_30);
  (pRVar4->super_RegexpBaseBindData).options.log_errors_ = false;
  *(RegexpReplaceBindData **)this = local_30._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> RegexReplaceBind(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {
	auto data = make_uniq<RegexpReplaceBindData>();

	data->constant_pattern = TryParseConstantPattern(context, *arguments[1], data->constant_string);
	if (arguments.size() == 4) {
		ParseRegexOptions(context, *arguments[3], data->options, &data->global_replace);
	}
	data->options.set_log_errors(false);
	return std::move(data);
}